

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O3

BIT_DStream_status BIT_reloadDStream(BIT_DStream_t *bitD)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  BIT_DStream_status BVar4;
  ulong uVar5;
  
  uVar1 = bitD->bitsConsumed;
  BVar4 = BIT_DStream_overflow;
  if (uVar1 < 0x41) {
    pcVar2 = bitD->ptr;
    if (bitD->limitPtr <= pcVar2) {
      bitD->ptr = pcVar2 + -(ulong)(uVar1 >> 3);
      bitD->bitsConsumed = uVar1 & 7;
      bitD->bitContainer = *(size_t *)(pcVar2 + -(ulong)(uVar1 >> 3));
      return BIT_DStream_unfinished;
    }
    pcVar3 = bitD->start;
    if (pcVar2 == pcVar3) {
      return (uVar1 == 0x40) + BIT_DStream_endOfBuffer;
    }
    uVar5 = (ulong)(uint)((int)pcVar2 - (int)pcVar3);
    if (pcVar2 + -(ulong)(uVar1 >> 3) >= pcVar3) {
      uVar5 = (ulong)(uVar1 >> 3);
    }
    BVar4 = (BIT_DStream_status)(pcVar2 + -(ulong)(uVar1 >> 3) < pcVar3);
    bitD->ptr = pcVar2 + -uVar5;
    bitD->bitsConsumed = uVar1 + (int)uVar5 * -8;
    bitD->bitContainer = *(size_t *)(pcVar2 + -uVar5);
  }
  return BVar4;
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStream(BIT_DStream_t* bitD)
{
    if (bitD->bitsConsumed > (sizeof(bitD->bitContainer)*8))  /* overflow detected, like end of stream */
        return BIT_DStream_overflow;

    if (bitD->ptr >= bitD->limitPtr) {
        bitD->ptr -= bitD->bitsConsumed >> 3;
        bitD->bitsConsumed &= 7;
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        return BIT_DStream_unfinished;
    }
    if (bitD->ptr == bitD->start) {
        if (bitD->bitsConsumed < sizeof(bitD->bitContainer)*8) return BIT_DStream_endOfBuffer;
        return BIT_DStream_completed;
    }
    /* start < ptr < limitPtr */
    {   U32 nbBytes = bitD->bitsConsumed >> 3;
        BIT_DStream_status result = BIT_DStream_unfinished;
        if (bitD->ptr - nbBytes < bitD->start) {
            nbBytes = (U32)(bitD->ptr - bitD->start);  /* ptr > start */
            result = BIT_DStream_endOfBuffer;
        }
        bitD->ptr -= nbBytes;
        bitD->bitsConsumed -= nbBytes*8;
        bitD->bitContainer = MEM_readLEST(bitD->ptr);   /* reminder : srcSize > sizeof(bitD->bitContainer), otherwise bitD->ptr == bitD->start */
        return result;
    }
}